

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromScene(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  Float radius;
  uint uVar1;
  size_t sVar2;
  LensElementInterface *pLVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  float fVar22;
  undefined1 auVar23 [16];
  Float t;
  Transform LensFromCamera;
  float local_15c;
  undefined1 local_158 [16];
  uint local_148;
  float local_144;
  Ray local_140;
  Normal3f local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Transform local_b0;
  
  sVar2 = (this->elementInterfaces).nStored;
  if (sVar2 == 0) {
    local_158 = ZEXT816(0);
  }
  else {
    fVar22 = 0.0;
    lVar6 = 0;
    do {
      fVar22 = fVar22 + *(float *)((long)&((this->elementInterfaces).ptr)->thickness + lVar6);
      local_158 = ZEXT416((uint)fVar22);
      lVar6 = lVar6 + 0x10;
    } while (sVar2 << 4 != lVar6);
  }
  Scale(&local_b0,1.0,1.0,-1.0);
  Transform::operator()(&local_140,&local_b0,rCamera,(Float *)0x0);
  if ((this->elementInterfaces).nStored != 0) {
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar8 = vxorps_avx512vl(local_158,auVar8);
    auVar20 = ZEXT1664(auVar8);
    lVar6 = 0;
    auVar21 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar7 = 0;
    do {
      pLVar3 = (this->elementInterfaces).ptr;
      local_118.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
      local_118.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      local_118.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
      radius = *(Float *)((long)&pLVar3->curvatureRadius + lVar6);
      local_158._0_4_ = radius;
      if ((radius != 0.0) || (NAN(radius))) {
        local_108 = auVar20._0_16_;
        bVar5 = IntersectSphericalElement
                          (radius,auVar20._0_4_ + radius,&local_140,&local_15c,&local_118);
        auVar21 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar20 = ZEXT1664(local_108);
        if (bVar5) goto LAB_00323b86;
LAB_00323bbf:
        bVar5 = false;
      }
      else {
        local_15c = (auVar20._0_4_ - local_140.o.super_Tuple3<pbrt::Point3,_float>.z) /
                    local_140.d.super_Tuple3<pbrt::Vector3,_float>.z;
        if (local_15c < 0.0) goto LAB_00323bbf;
LAB_00323b86:
        auVar12._8_8_ = 0;
        auVar12._0_4_ = local_140.d.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar12._4_4_ = local_140.d.super_Tuple3<pbrt::Vector3,_float>.y;
        fVar9 = local_140.d.super_Tuple3<pbrt::Vector3,_float>.x;
        fVar16 = local_140.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar11._0_4_ = fVar9 * local_15c + local_140.o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar11._4_4_ = fVar16 * local_15c + local_140.o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar11._8_4_ = local_15c * 0.0 + 0.0;
        auVar11._12_4_ = local_15c * 0.0 + 0.0;
        auVar14._0_4_ = auVar11._0_4_ * auVar11._0_4_;
        auVar14._4_4_ = auVar11._4_4_ * auVar11._4_4_;
        auVar14._8_4_ = auVar11._8_4_ * auVar11._8_4_;
        auVar14._12_4_ = auVar11._12_4_ * auVar11._12_4_;
        auVar8 = vmovshdup_avx(auVar14);
        auVar8 = vfmadd231ss_fma(auVar8,auVar11,auVar11);
        fVar22 = *(float *)((long)&pLVar3->apertureRadius + lVar6);
        if (fVar22 * fVar22 < auVar8._0_4_) goto LAB_00323bbf;
        local_140.o.super_Tuple3<pbrt::Point3,_float>.z =
             local_15c * local_140.d.super_Tuple3<pbrt::Vector3,_float>.z +
             local_140.o.super_Tuple3<pbrt::Point3,_float>.z;
        local_140.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar11);
        if (((float)local_158._0_4_ != 0.0) || (NAN((float)local_158._0_4_))) {
          fVar22 = 1.0;
          if (uVar7 != 0) {
            auVar19._0_4_ = *(float *)((long)(this->elementInterfaces).ptr + lVar6 + -8);
            if ((auVar19._0_4_ != 0.0) || (fVar22 = 1.0, NAN(auVar19._0_4_))) {
              fVar22 = auVar19._0_4_;
            }
          }
          uVar1 = *(uint *)((long)&((this->elementInterfaces).ptr)->eta + lVar6);
          fVar9 = fVar9 * fVar9 + fVar16 * fVar16 +
                  local_140.d.super_Tuple3<pbrt::Vector3,_float>.z *
                  local_140.d.super_Tuple3<pbrt::Vector3,_float>.z;
          if (fVar9 < 0.0) {
            local_108 = auVar20._0_16_;
            local_c8._0_4_ = fVar22;
            local_d8 = ZEXT416((uint)fVar16);
            local_e8 = ZEXT416(uVar1);
            local_f8 = ZEXT416((uint)local_140.d.super_Tuple3<pbrt::Vector3,_float>.z);
            local_158 = auVar12;
            fVar9 = sqrtf(fVar9);
            auVar21 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar20 = ZEXT1664(local_108);
            auVar8 = local_d8;
            auVar12 = local_158;
            auVar11 = local_e8;
            auVar14 = local_f8;
            fVar22 = (float)local_c8._0_4_;
          }
          else {
            auVar8 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
            fVar9 = auVar8._0_4_;
            auVar8 = ZEXT416((uint)fVar16);
            auVar11 = ZEXT416(uVar1);
            auVar14 = ZEXT416((uint)local_140.d.super_Tuple3<pbrt::Vector3,_float>.z);
          }
          uVar4 = vcmpss_avx512f(auVar11,auVar21._0_16_,4);
          bVar5 = (bool)((byte)uVar4 & 1);
          auVar15._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
          auVar15._8_4_ = auVar14._8_4_ ^ 0x80000000;
          auVar15._12_4_ = auVar14._12_4_ ^ 0x80000000;
          auVar8 = vinsertps_avx(auVar12,auVar8,0x10);
          auVar17._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
          auVar17._8_4_ = auVar8._8_4_ ^ 0x80000000;
          auVar17._12_4_ = auVar8._12_4_ ^ 0x80000000;
          auVar18._4_4_ = fVar9;
          auVar18._0_4_ = fVar9;
          auVar18._8_4_ = fVar9;
          auVar18._12_4_ = fVar9;
          auVar8 = vdivps_avx(auVar17,auVar18);
          auVar12 = vmovshdup_avx(auVar8);
          auVar19._0_4_ = -auVar14._0_4_ / fVar9;
          auVar19._4_12_ = auVar15._4_12_;
          auVar23._8_8_ = 0;
          auVar23._0_4_ = local_118.super_Tuple3<pbrt::Normal3,_float>.x;
          auVar23._4_4_ = local_118.super_Tuple3<pbrt::Normal3,_float>.y;
          auVar14 = vmovshdup_avx(auVar23);
          fVar22 = (float)((uint)bVar5 * auVar11._0_4_ + (uint)!bVar5 * 0x3f800000) / fVar22;
          auVar12 = vfmadd213ss_fma(auVar14,auVar12,
                                    ZEXT416((uint)(local_118.super_Tuple3<pbrt::Normal3,_float>.z *
                                                  auVar19._0_4_)));
          auVar11 = vfmsub231ss_fma(ZEXT416((uint)(local_118.super_Tuple3<pbrt::Normal3,_float>.z *
                                                  auVar19._0_4_)),
                                    ZEXT416((uint)local_118.super_Tuple3<pbrt::Normal3,_float>.z),
                                    auVar19);
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ + auVar11._0_4_)),auVar23,auVar8);
          auVar12 = vfnmadd213ss_fma(auVar11,auVar11,SUB6416(ZEXT464(0x3f800000),0));
          fVar9 = 0.0;
          auVar12 = vmaxss_avx(auVar12,ZEXT816(0) << 0x20);
          fVar16 = auVar12._0_4_ / (fVar22 * fVar22);
          auVar12 = ZEXT816(0) << 0x20;
          if (fVar16 < 1.0) {
            auVar12 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar16)),auVar21._0_16_);
            if (auVar12._0_4_ < 0.0) {
              local_108 = auVar20._0_16_;
              local_158._0_4_ = auVar19._0_4_;
              local_e8 = ZEXT416((uint)fVar22);
              local_f8._0_4_ = local_118.super_Tuple3<pbrt::Normal3,_float>.z;
              local_148 = auVar11._0_4_;
              local_144 = fVar16;
              local_d8 = auVar23;
              local_c8 = auVar8;
              fVar9 = sqrtf(auVar12._0_4_);
              auVar11 = ZEXT416(local_148);
              auVar21 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar20 = ZEXT1664(local_108);
              fVar16 = local_144;
              local_118.super_Tuple3<pbrt::Normal3,_float>.z = (float)local_f8._0_4_;
              auVar23 = local_d8;
              fVar22 = (float)local_e8._0_4_;
              auVar8 = local_c8;
              auVar19._0_4_ = (float)local_158._0_4_;
            }
            else {
              auVar12 = vsqrtss_avx(auVar12,auVar12);
              fVar9 = auVar12._0_4_;
            }
            fVar9 = auVar11._0_4_ / fVar22 - fVar9;
            auVar13._4_4_ = fVar22;
            auVar13._0_4_ = fVar22;
            auVar13._8_4_ = fVar22;
            auVar13._12_4_ = fVar22;
            auVar8 = vdivps_avx(auVar8,auVar13);
            auVar10._0_4_ = auVar23._0_4_ * fVar9;
            auVar10._4_4_ = auVar23._4_4_ * fVar9;
            auVar10._8_4_ = auVar23._8_4_ * fVar9;
            auVar10._12_4_ = auVar23._12_4_ * fVar9;
            auVar12 = vsubps_avx(auVar10,auVar8);
            fVar9 = local_118.super_Tuple3<pbrt::Normal3,_float>.z * fVar9 - auVar19._0_4_ / fVar22;
          }
          if (1.0 <= fVar16) goto LAB_00323bbf;
          local_140.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar12);
          local_140.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar9;
        }
        auVar20 = ZEXT464((uint)(auVar20._0_4_ + *(float *)((long)&pLVar3->thickness + lVar6)));
        bVar5 = true;
      }
      if (!bVar5) {
        return 0.0;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (this->elementInterfaces).nStored);
  }
  if (rOut != (Ray *)0x0) {
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.x = local_140.o.super_Tuple3<pbrt::Point3,_float>.x;
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.y = local_140.o.super_Tuple3<pbrt::Point3,_float>.y;
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.z = -local_140.o.super_Tuple3<pbrt::Point3,_float>.z
    ;
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.x =
         local_140.d.super_Tuple3<pbrt::Vector3,_float>.x;
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.y =
         local_140.d.super_Tuple3<pbrt::Vector3,_float>.y;
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.z =
         -local_140.d.super_Tuple3<pbrt::Vector3,_float>.z;
    rOut->time = local_140.time;
    (rOut->medium).
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
  }
  return 1.0;
}

Assistant:

Float RealisticCamera::TraceLensesFromScene(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = -LensFrontZ();
    // Transform _rCamera_ from camera to lens system space
    const Transform LensFromCamera = Scale(1, 1, -1);
    Ray rLens = LensFromCamera(rCamera);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;
        } else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }

        // Test intersection point against element aperture
        // Don't worry about the aperture image here.
        Point3f pHit = rLens(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        if (r2 > element.apertureRadius * element.apertureRadius)
            return 0;
        rLens.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0)
                              ? 1
                              : elementInterfaces[i - 1].eta;
            Float eta_t = (elementInterfaces[i].eta != 0) ? elementInterfaces[i].eta : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &wt))
                return 0;
            rLens.d = wt;
        }
        elementZ += element.thickness;
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);
    return 1;
}